

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O1

REF_STATUS ref_search_create(REF_SEARCH *ref_search_ptr,REF_INT n)

{
  size_t __size;
  uint uVar1;
  bool bVar2;
  uint uVar3;
  REF_SEARCH pRVar4;
  REF_INT *pRVar5;
  REF_DBL *pRVar6;
  undefined8 uVar7;
  char *pcVar8;
  
  pRVar4 = (REF_SEARCH)malloc(0x40);
  *ref_search_ptr = pRVar4;
  if (pRVar4 == (REF_SEARCH)0x0) {
    pcVar8 = "malloc *ref_search_ptr of REF_SEARCH_STRUCT NULL";
    uVar7 = 0x22;
  }
  else {
    pRVar4->d = 3;
    pRVar4->n = n;
    pRVar4->empty = 0;
    if (n < 0) {
      bVar2 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",0x29
             ,"ref_search_create","malloc ref_search->item of REF_INT negative");
      n = 1;
    }
    else {
      pRVar5 = (REF_INT *)malloc((ulong)(uint)n << 2);
      pRVar4->item = pRVar5;
      if (pRVar5 == (REF_INT *)0x0) {
        bVar2 = false;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
               0x29,"ref_search_create","malloc ref_search->item of REF_INT NULL");
        n = 2;
      }
      else {
        bVar2 = true;
        if (0 < (long)pRVar4->n) {
          memset(pRVar5,0xff,(long)pRVar4->n << 2);
        }
      }
    }
    if (!bVar2) {
      return n;
    }
    if ((long)pRVar4->n < 0) {
      bVar2 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",0x2a
             ,"ref_search_create","malloc ref_search->left of REF_INT negative");
      n = 1;
    }
    else {
      pRVar5 = (REF_INT *)malloc((long)pRVar4->n << 2);
      pRVar4->left = pRVar5;
      if (pRVar5 == (REF_INT *)0x0) {
        bVar2 = false;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
               0x2a,"ref_search_create","malloc ref_search->left of REF_INT NULL");
        n = 2;
      }
      else {
        bVar2 = true;
        if (0 < (long)pRVar4->n) {
          memset(pRVar5,0xff,(long)pRVar4->n << 2);
        }
      }
    }
    if (!bVar2) {
      return n;
    }
    if ((long)pRVar4->n < 0) {
      bVar2 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",0x2b
             ,"ref_search_create","malloc ref_search->right of REF_INT negative");
      n = 1;
    }
    else {
      pRVar5 = (REF_INT *)malloc((long)pRVar4->n << 2);
      pRVar4->right = pRVar5;
      if (pRVar5 == (REF_INT *)0x0) {
        bVar2 = false;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
               0x2b,"ref_search_create","malloc ref_search->right of REF_INT NULL");
        n = 2;
      }
      else {
        bVar2 = true;
        if (0 < (long)pRVar4->n) {
          memset(pRVar5,0xff,(long)pRVar4->n << 2);
        }
      }
    }
    if (!bVar2) {
      return n;
    }
    uVar1 = pRVar4->n;
    uVar3 = pRVar4->d * uVar1;
    if ((int)uVar3 < 0) {
      pcVar8 = "malloc ref_search->pos of REF_DBL negative";
      uVar7 = 0x2d;
LAB_0015284f:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
             uVar7,"ref_search_create",pcVar8);
      return 1;
    }
    pRVar6 = (REF_DBL *)malloc((ulong)uVar3 << 3);
    pRVar4->pos = pRVar6;
    if (pRVar6 == (REF_DBL *)0x0) {
      pcVar8 = "malloc ref_search->pos of REF_DBL NULL";
      uVar7 = 0x2d;
    }
    else {
      if ((int)uVar1 < 0) {
        pcVar8 = "malloc ref_search->radius of REF_DBL negative";
        uVar7 = 0x2e;
        goto LAB_0015284f;
      }
      __size = (ulong)uVar1 * 8;
      pRVar6 = (REF_DBL *)malloc(__size);
      pRVar4->radius = pRVar6;
      if (pRVar6 == (REF_DBL *)0x0) {
        pcVar8 = "malloc ref_search->radius of REF_DBL NULL";
        uVar7 = 0x2e;
      }
      else {
        pRVar6 = (REF_DBL *)malloc(__size);
        pRVar4->children_ball = pRVar6;
        if (pRVar6 != (REF_DBL *)0x0) {
          if ((ulong)uVar1 != 0) {
            memset(pRVar6,0,__size);
            return 0;
          }
          return 0;
        }
        pcVar8 = "malloc ref_search->children_ball of REF_DBL NULL";
        uVar7 = 0x2f;
      }
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",uVar7,
         "ref_search_create",pcVar8);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_search_create(REF_SEARCH *ref_search_ptr, REF_INT n) {
  REF_SEARCH ref_search;

  ref_malloc(*ref_search_ptr, 1, REF_SEARCH_STRUCT);
  ref_search = (*ref_search_ptr);

  ref_search->d = 3;
  ref_search->n = n;
  ref_search->empty = 0;

  ref_malloc_init(ref_search->item, ref_search->n, REF_INT, REF_EMPTY);
  ref_malloc_init(ref_search->left, ref_search->n, REF_INT, REF_EMPTY);
  ref_malloc_init(ref_search->right, ref_search->n, REF_INT, REF_EMPTY);

  ref_malloc(ref_search->pos, ref_search->d * ref_search->n, REF_DBL);
  ref_malloc(ref_search->radius, ref_search->n, REF_DBL);
  ref_malloc_init(ref_search->children_ball, ref_search->n, REF_DBL, 0.0);

  return REF_SUCCESS;
}